

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

void __thiscall
BuildLog::LogEntry::LogEntry
          (LogEntry *this,string *output,uint64_t command_hash,int start_time,int end_time,
          TimeStamp restat_mtime)

{
  std::__cxx11::string::string((string *)this,(string *)output);
  this->command_hash = command_hash;
  this->start_time = start_time;
  this->end_time = end_time;
  this->mtime = restat_mtime;
  return;
}

Assistant:

BuildLog::LogEntry::LogEntry(const string& output, uint64_t command_hash,
  int start_time, int end_time, TimeStamp restat_mtime)
  : output(output), command_hash(command_hash),
    start_time(start_time), end_time(end_time), mtime(restat_mtime)
{}